

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::clear
          (SmallVector<std::function<void_()>,_0UL> *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (this->super_VectorView<std::function<void_()>_>).buffer_size;
      uVar2 = uVar2 + 1) {
    ::std::_Function_base::~_Function_base
              ((_Function_base *)
               ((long)&(((this->super_VectorView<std::function<void_()>_>).ptr)->
                       super__Function_base)._M_functor + lVar1));
    lVar1 = lVar1 + 0x20;
  }
  (this->super_VectorView<std::function<void_()>_>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}